

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void glist_scalar(_glist *glist,t_symbol *classname,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_template *ptVar2;
  t_symbol *ptVar3;
  t_atom *vec_00;
  t_atom *vec;
  int nextmsg;
  int natoms;
  _binbuf *b;
  t_symbol *templatesym;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *classname_local;
  _glist *glist_local;
  
  templatesym = (t_symbol *)argv;
  argv_local._4_4_ = argc;
  ptStack_18 = classname;
  classname_local = (t_symbol *)glist;
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  b = (_binbuf *)canvas_makebindsym(ptVar1);
  vec._0_4_ = 0;
  ptVar2 = template_findbyname((t_symbol *)b);
  ptVar1 = classname_local;
  if (ptVar2 == (t_template *)0x0) {
    ptVar3 = atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)templatesym);
    pd_error(ptVar1,"%s: no such template",ptVar3->s_name);
  }
  else {
    _nextmsg = binbuf_new();
    binbuf_restore(_nextmsg,argv_local._4_4_,(t_atom *)templatesym);
    vec._4_4_ = binbuf_getnatom(_nextmsg);
    vec_00 = binbuf_getvec(_nextmsg);
    canvas_readscalar((_glist *)classname_local,vec._4_4_,vec_00,(int *)&vec,0);
    binbuf_free(_nextmsg);
  }
  return;
}

Assistant:

void glist_scalar(t_glist *glist,
    t_symbol *classname, int argc, t_atom *argv)
{
    t_symbol *templatesym =
        canvas_makebindsym(atom_getsymbolarg(0, argc, argv));
    t_binbuf *b;
    int natoms, nextmsg = 0;
    t_atom *vec;
    if (!template_findbyname(templatesym))
    {
        pd_error(glist, "%s: no such template",
            atom_getsymbolarg(0, argc, argv)->s_name);
        return;
    }

    b = binbuf_new();
    binbuf_restore(b, argc, argv);
    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);
    canvas_readscalar(glist, natoms, vec, &nextmsg, 0);
    binbuf_free(b);
}